

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::AddLine(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float thickness)

{
  float fVar1;
  float fVar2;
  ImVec2 *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  uint uVar6;
  ImVec2 *pIVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  if (0xffffff < col) {
    fVar1 = a->x;
    fVar2 = a->y;
    iVar10 = (this->_Path).Size;
    iVar11 = (this->_Path).Capacity;
    if (iVar10 == iVar11) {
      iVar10 = iVar10 + 1;
      if (iVar11 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar11 / 2 + iVar11;
      }
      if (iVar10 < iVar8) {
        iVar10 = iVar8;
      }
      if (iVar11 < iVar10) {
        pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar10 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar7,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar7;
        (this->_Path).Capacity = iVar10;
      }
    }
    IVar5.y = fVar2 + 0.5;
    IVar5.x = fVar1 + 0.5;
    (this->_Path).Data[(this->_Path).Size] = IVar5;
    iVar11 = (this->_Path).Size;
    iVar8 = (this->_Path).Capacity;
    iVar10 = iVar11 + 1;
    (this->_Path).Size = iVar10;
    fVar1 = b->x;
    fVar2 = b->y;
    if (iVar10 == iVar8) {
      iVar11 = iVar11 + 2;
      if (iVar8 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar8 / 2 + iVar8;
      }
      if (iVar11 < iVar10) {
        iVar11 = iVar10;
      }
      if (iVar8 < iVar11) {
        pIVar7 = (ImVec2 *)ImGui::MemAlloc((long)iVar11 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar7,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar7;
        (this->_Path).Capacity = iVar11;
      }
    }
    IVar4.y = fVar2 + 0.5;
    IVar4.x = fVar1 + 0.5;
    (this->_Path).Data[(this->_Path).Size] = IVar4;
    iVar10 = (this->_Path).Size + 1;
    (this->_Path).Size = iVar10;
    AddPolyline(this,(this->_Path).Data,iVar10,col,false,thickness);
    iVar10 = (this->_Path).Capacity;
    if (iVar10 < 0) {
      uVar9 = iVar10 / 2 + iVar10;
      uVar6 = 0;
      if (0 < (int)uVar9) {
        uVar6 = uVar9;
      }
      pIVar7 = (ImVec2 *)ImGui::MemAlloc((ulong)uVar6 * 8);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar7,pIVar3,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar7;
      (this->_Path).Capacity = uVar6;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& a, const ImVec2& b, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(a + ImVec2(0.5f,0.5f));
    PathLineTo(b + ImVec2(0.5f,0.5f));
    PathStroke(col, false, thickness);
}